

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

Data processObject(fy_node *node)

{
  DataType DVar1;
  Object o;
  fy_node_pair *fynp;
  fy_node *pfVar2;
  Data pvVar3;
  Data data;
  String name;
  void *iter;
  void *local_30;
  
  o = newObject();
  local_30 = (void *)0x0;
  fynp = fy_node_mapping_iterate(node,&local_30);
  if (fynp != (fy_node_pair *)0x0) {
    do {
      pfVar2 = fy_node_pair_key(fynp);
      pvVar3 = parseYaml(pfVar2);
      pfVar2 = fy_node_pair_value(fynp);
      data = parseYaml(pfVar2);
      if ((pvVar3 == (Data)0x0) || (data == (Data)0x0)) {
        if (pvVar3 != (Data)0x0) {
          deepFreeData(pvVar3);
        }
        if (data == (Data)0x0) goto LAB_0011975e;
LAB_00119756:
        deepFreeData(data);
LAB_0011975e:
        freeObject(o);
        return (Data)0x0;
      }
      DVar1 = getDataType(pvVar3);
      if (DVar1 != StringType) {
        deepFreeData(pvVar3);
        goto LAB_00119756;
      }
      name = valString(pvVar3);
      putObject(o,name,data);
      shallowFreeData(pvVar3);
      fynp = fy_node_mapping_iterate(node,&local_30);
    } while (fynp != (fy_node_pair *)0x0);
  }
  pvVar3 = newDataObject(o);
  return pvVar3;
}

Assistant:

Data processObject(struct fy_node *node) {
    Object o = newObject();
    void *iter = NULL;
    struct fy_node_pair *pair;
    Data key, val;
    while ((pair = fy_node_mapping_iterate(node, &iter))) {
        key = parseYaml(fy_node_pair_key(pair));
        val = parseYaml(fy_node_pair_value(pair));
        if (key == NULL || val == NULL || getDataType(key) != StringType) {
            if (key != NULL)deepFreeData(key);
            if (val != NULL)deepFreeData(val);
            freeObject(o);
            return NULL;
        }
        putObject(o, valString(key), val);
        shallowFreeData(key);
    }
    return newDataObject(o);
}